

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

global_object_create_result *
mjs::anon_unknown_35::make_console_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  anon_class_24_2_89ad9abc_for_f local_98;
  anon_class_24_2_89ad9abc_for_f local_80;
  anon_class_1_0_00000001_for_f local_61;
  undefined1 local_60 [8];
  shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>
  timers;
  anon_class_16_1_570cf4e1_for_f local_40;
  undefined1 local_30 [8];
  object_ptr console;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  console.super_gc_heap_ptr_untyped._8_8_ =
       gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
  gc_heap_ptr<mjs::global_object>::operator->(global);
  global_object::make_object((global_object *)local_30);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_40.global,global);
  put_native_function<mjs::(anonymous_namespace)::make_console_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__0>
            (global,(object_ptr *)local_30,"assert",&local_40,1);
  (anonymous_namespace)::make_console_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::~__0
            ((__0 *)&local_40);
  std::
  make_shared<std::unordered_map<std::__cxx11::wstring,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>>
            ();
  put_native_function<mjs::(anonymous_namespace)::make_console_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__1>
            (global,(object_ptr *)local_30,"log",&local_61,1);
  std::
  shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>
  ::shared_ptr(&local_80.timers,
               (shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>
                *)local_60);
  local_80.h = (gc_heap *)console.super_gc_heap_ptr_untyped._8_8_;
  put_native_function<mjs::(anonymous_namespace)::make_console_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__2>
            (global,(object_ptr *)local_30,"time",&local_80,1);
  (anonymous_namespace)::make_console_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::~__2
            ((__2 *)&local_80);
  std::
  shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>
  ::shared_ptr(&local_98.timers,
               (shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>
                *)local_60);
  local_98.h = (gc_heap *)console.super_gc_heap_ptr_untyped._8_8_;
  put_native_function<mjs::(anonymous_namespace)::make_console_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__3>
            (global,(object_ptr *)local_30,"timeEnd",&local_98,1);
  (anonymous_namespace)::make_console_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_3::~__3
            ((__3 *)&local_98);
  gc_heap_ptr<mjs::object>::gc_heap_ptr
            (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::object> *)local_30);
  gc_heap_ptr<mjs::object>::gc_heap_ptr(&__return_storage_ptr__->prototype,(nullptr_t)0x0);
  std::
  shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>
  ::~shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>
                 *)local_60);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_console_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto console = global->make_object();

    put_native_function(global, console, "assert", [global](const value&, const std::vector<value>& args) {
        const auto val = !args.empty() ? args.front() : value::undefined;
        if (to_boolean(val)) {
            return value::undefined;
        }
        std::wostringstream woss;
        if (args.size() > 1) {
            auto&h = global.heap();
            for (size_t i = 1; i < args.size(); ++i) {
                if (i > 1) woss << " ";
                woss << to_string(h, args[i]).view();
            }
        } else {
            debug_print(woss, val, 4);
            woss << " == true";
        }
        throw native_error_exception{native_error_type::assertion, global->stack_trace(), woss.str()};
    }, 1);

    using timer_clock = std::chrono::steady_clock;

    auto timers = std::make_shared<std::unordered_map<std::wstring, timer_clock::time_point>>();
    put_native_function(global, console, "log", [](const value&, const std::vector<value>& args) {
        for (const auto& a: args) {
            if (a.type() == value_type::string) {
                std::wcout << a.string_value();
            } else {
                mjs::debug_print(std::wcout, a, 4);
            }
            std::wcout << ' ';
        }
        std::wcout << '\n';
        return value::undefined;
    }, 1);
    put_native_function(global, console, "time", [timers, &h](const value&, const std::vector<value>& args) {
        if (args.empty()) {
            THROW_RUNTIME_ERROR("Missing argument to console.time()");
        }
        auto label = to_string(h, args.front());
        (*timers)[std::wstring{label.view()}] = timer_clock::now();
        return value::undefined;
    }, 1);
    put_native_function(global, console, "timeEnd", [timers, &h](const value&, const std::vector<value>& args) {
        const auto end_time = timer_clock::now();
        if (args.empty()) {
            THROW_RUNTIME_ERROR("Missing argument to console.timeEnd()");
        }
        auto label = to_string(h, args.front());
        auto it = timers->find(std::wstring{label.view()});
        if (it == timers->end()) {
            std::wostringstream woss;
            woss << "Timer not found: " << label;
            THROW_RUNTIME_ERROR(woss.str());
        }
        std::wcout << label << ": " << show_duration(end_time - it->second) << "\n";
        timers->erase(it);
        return value::undefined;
    }, 1);

    return { console, nullptr };
}